

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O1

ConversionResult
convertUTF::ConvertUTF8toUTF16
          (UTF8 **sourceStart,UTF8 *sourceEnd,UTF16 **targetStart,UTF16 *targetEnd,
          ConversionFlags flags)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  Boolean BVar4;
  ConversionResult CVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ConversionResult CVar10;
  UTF16 *pUVar11;
  ulong uVar12;
  byte *source;
  
  source = *sourceStart;
  pUVar11 = *targetStart;
  CVar10 = conversionOK;
  do {
    CVar5 = CVar10;
    if (sourceEnd <= source) break;
    bVar2 = *source;
    bVar3 = trailingBytesForUTF8[bVar2];
    uVar12 = (ulong)bVar3;
    if (source + uVar12 < sourceEnd) {
      lVar1 = uVar12 + 1;
      BVar4 = anon_unknown_11::isLegalUTF8(source,(int)lVar1);
      CVar5 = sourceIllegal;
      iVar6 = 0;
      iVar8 = 0;
      iVar7 = 0;
      if (BVar4) {
        switch(uVar12) {
        case 0:
          uVar9 = (uint)bVar3;
          goto LAB_001833ae;
        case 1:
          goto LAB_001833a2;
        case 2:
          break;
        case 5:
          source = source + 1;
          iVar8 = (uint)bVar2 << 6;
        case 4:
          bVar2 = *source;
          source = source + 1;
          iVar6 = ((uint)bVar2 + iVar8) * 0x40;
        case 3:
          bVar2 = *source;
          source = source + 1;
          iVar7 = ((uint)bVar2 + iVar6) * 0x40;
          break;
        default:
          goto switchD_00183333_default;
        }
        bVar2 = *source;
        source = source + 1;
        iVar7 = ((uint)bVar2 + iVar7) * 0x40;
LAB_001833a2:
        bVar2 = *source;
        source = source + 1;
        uVar9 = ((uint)bVar2 + iVar7) * 0x40;
LAB_001833ae:
        bVar2 = *source;
        source = source + 1;
        iVar6 = bVar2 + uVar9;
switchD_00183333_default:
        if (targetEnd <= pUVar11) {
LAB_001833ed:
          source = source + -lVar1;
          CVar5 = targetExhausted;
          goto LAB_001833f2;
        }
        uVar9 = iVar6 - *(int *)(offsetsFromUTF8 + uVar12 * 4);
        if (uVar9 < 0x10000) {
          if ((uVar9 & 0xf800) == 0xd800) {
LAB_00183409:
            if (flags == strictConversion) {
              source = source + -lVar1;
              goto LAB_001833f2;
            }
            *pUVar11 = 0xfffd;
          }
          else {
            *pUVar11 = (ushort)uVar9;
          }
          pUVar11 = pUVar11 + 1;
        }
        else {
          if (0x10ffff < uVar9) goto LAB_00183409;
          if (targetEnd <= pUVar11 + 1) goto LAB_001833ed;
          *pUVar11 = (short)(uVar9 + 0x3ff0000 >> 10) + 0xd800;
          pUVar11[1] = (ushort)uVar9 & 0x3ff | 0xdc00;
          pUVar11 = pUVar11 + 2;
        }
        iVar6 = 1;
        CVar5 = CVar10;
      }
    }
    else {
      CVar5 = sourceExhausted;
LAB_001833f2:
      iVar6 = 0;
    }
    CVar10 = CVar5;
  } while ((char)iVar6 != '\0');
  *sourceStart = source;
  *targetStart = pUVar11;
  return CVar5;
}

Assistant:

ConversionResult ConvertUTF8toUTF16(const UTF8** sourceStart, const UTF8* sourceEnd, UTF16** targetStart,
                                    const UTF16* targetEnd, const ConversionFlags flags)
{
    ConversionResult result = ConversionResult::conversionOK;
    const UTF8* source = *sourceStart;
    UTF16* target = *targetStart;
    while (source < sourceEnd)
    {
        UTF32 ch = 0;
        const uint8_t extraBytesToRead = trailingBytesForUTF8[*source];
        if (source + extraBytesToRead >= sourceEnd)
        {
            result = ConversionResult::sourceExhausted;
            break;
        }
        /* Do this check whether lenient or strict */
        if (!isLegalUTF8(source, extraBytesToRead + 1))
        {
            result = ConversionResult::sourceIllegal;
            break;
        }
        /*
         * The cases all fall through. See "Note A" below.
         */
        switch (extraBytesToRead)
        {
        case 5:
            ch += *source++;
            ch <<= 6; /* remember, illegal UTF-8 */
            [[fallthrough]];
        case 4:
            ch += *source++;
            ch <<= 6; /* remember, illegal UTF-8 */
            [[fallthrough]];
        case 3:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 2:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 1:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 0:
            ch += *source++;
            break;
        default:;
        }
        ch -= offsetsFromUTF8[extraBytesToRead];

        if (target >= targetEnd)
        {
            source -= (extraBytesToRead + 1); /* Back up source pointer! */
            result = ConversionResult::targetExhausted;
            break;
        }
        if (ch <= UNI_MAX_BMP)
        { /* Target is a character <= 0xFFFF */
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END)
            {
                if (flags == ConversionFlags::strictConversion)
                {
                    source -= (extraBytesToRead + 1); /* return to the illegal value itself */
                    result = ConversionResult::sourceIllegal;
                    break;
                }
                *target++ = UNI_REPLACEMENT_CHAR;
            }
            else
            {
                *target++ = static_cast<UTF16>(ch); /* normal case */
            }
        }
        else if (ch > UNI_MAX_UTF16)
        {
            if (flags == ConversionFlags::strictConversion)
            {
                result = ConversionResult::sourceIllegal;
                source -= extraBytesToRead + 1; /* return to the start */
                break;                          /* Bail out; shouldn't continue */
            }
            *target++ = UNI_REPLACEMENT_CHAR;
        }
        else
        {
            /* target is a character in range 0xFFFF - 0x10FFFF. */
            if (target + 1 >= targetEnd)
            {
                source -= (extraBytesToRead + 1); /* Back up source pointer! */
                result = ConversionResult::targetExhausted;
                break;
            }
            ch -= halfBase;
            *target++ = static_cast<UTF16>((ch >> halfShift) + UNI_SUR_HIGH_START);
            *target++ = static_cast<UTF16>((ch & halfMask) + UNI_SUR_LOW_START);
        }
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}